

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void __thiscall
Highs::setNonbasicStatusInterface(Highs *this,HighsIndexCollection *index_collection,bool columns)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  undefined7 in_register_00000011;
  int iVar7;
  long lVar8;
  HighsBasisStatus HVar9;
  HighsInt set_to_ix;
  HighsInt ignore_to_ix;
  HighsInt current_set_entry;
  HighsInt set_from_ix;
  HighsInt to_k;
  HighsInt ignore_from_ix;
  HighsInt from_k;
  int local_84;
  undefined4 local_80;
  HighsInt local_7c;
  int local_78;
  HighsInt local_74;
  int local_70;
  int local_6c;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  HighsIndexCollection *local_40;
  HighsInt local_38;
  int local_34;
  
  local_80 = (undefined4)CONCAT71(in_register_00000011,columns);
  if ((this->basis_).valid == true) {
    bVar3 = (this->ekk_instance_).status_.has_basis;
    limits(index_collection,&local_34,&local_6c);
    local_7c = -1;
    local_74 = 0;
    if (local_34 <= local_6c) {
      local_78 = (this->model_).lp_.num_row_;
      if ((char)local_80 != '\0') {
        local_78 = (this->model_).lp_.num_col_;
      }
      local_78 = local_78 + -1;
      iVar7 = local_34;
      local_40 = index_collection;
      do {
        updateOutInIndex(local_40,&local_70,&local_84,&local_38,&local_7c,&local_74);
        if ((char)local_80 == '\0') {
          if (local_70 <= local_84) {
            lVar8 = (long)local_70 + -1;
            do {
              HVar9 = (this->basis_).row_status.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar8 + 1];
              if (HVar9 != kBasic) {
                dVar1 = (this->model_).lp_.row_lower_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8 + 1];
                dVar2 = (this->model_).lp_.row_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8 + 1];
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                  uStack_50 = 0;
                  uStack_60 = 0;
                  local_68 = dVar2;
                  local_58 = dVar1;
                  bVar4 = highs_isInfinity(-dVar1);
                  bVar5 = highs_isInfinity(local_68);
                  if (bVar4) {
                    bVar6 = !bVar5;
                    HVar9 = bVar5 + kUpper;
                  }
                  else {
                    bVar6 = 0xff;
                    if (bVar5) {
                      HVar9 = kLower;
                    }
                    else if (HVar9 != kLower) {
                      if (HVar9 == kNonbasic) {
                        bVar6 = -(ABS(local_58) < ABS(local_68)) | 1;
                        HVar9 = (ABS(local_68) <= ABS(local_58)) * '\x02';
                      }
                      else {
                        bVar6 = 1;
                      }
                    }
                  }
                }
                else {
                  bVar6 = 0;
                  if (HVar9 == kNonbasic) {
                    HVar9 = kLower;
                  }
                }
                (this->basis_).row_status.
                super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + 1] = HVar9;
                if (bVar3 != false) {
                  (this->ekk_instance_).basis_.nonbasicFlag_.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8 + 1 + (long)(this->model_).lp_.num_col_] =
                       '\x01';
                  (this->ekk_instance_).basis_.nonbasicMove_.
                  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8 + 1 + (long)(this->model_).lp_.num_col_] =
                       bVar6;
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < local_84);
          }
        }
        else if (local_70 <= local_84) {
          lVar8 = (long)local_70 + -1;
          do {
            HVar9 = (this->basis_).col_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8 + 1];
            if (HVar9 != kBasic) {
              dVar1 = (this->model_).lp_.col_lower_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + 1];
              dVar2 = (this->model_).lp_.col_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar8 + 1];
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                uStack_50 = 0;
                uStack_60 = 0;
                local_68 = dVar2;
                local_58 = dVar1;
                bVar4 = highs_isInfinity(-dVar1);
                bVar5 = highs_isInfinity(local_68);
                if (bVar4) {
                  bVar6 = bVar5 - 1;
                  HVar9 = bVar5 + kUpper;
                }
                else {
                  bVar6 = 1;
                  if (bVar5) {
                    HVar9 = kLower;
                  }
                  else if (HVar9 != kLower) {
                    if (HVar9 == kNonbasic) {
                      bVar6 = -(ABS(local_68) <= ABS(local_58)) | 1;
                      HVar9 = (ABS(local_68) <= ABS(local_58)) * '\x02';
                    }
                    else {
                      bVar6 = 0xff;
                    }
                  }
                }
              }
              else {
                bVar6 = 0;
                if (HVar9 == kNonbasic) {
                  HVar9 = kLower;
                }
              }
              (this->basis_).col_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8 + 1] = HVar9;
              if (bVar3 != false) {
                (this->ekk_instance_).basis_.nonbasicFlag_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + 1] = '\x01';
                (this->ekk_instance_).basis_.nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8 + 1] = bVar6;
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_84);
        }
      } while ((local_7c < local_78) && (bVar4 = iVar7 < local_6c, iVar7 = iVar7 + 1, bVar4));
    }
  }
  return;
}

Assistant:

void Highs::setNonbasicStatusInterface(
    const HighsIndexCollection& index_collection, const bool columns) {
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.valid) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  HighsInt ix_dim;
  if (columns) {
    ix_dim = lp.num_col_;
  } else {
    ix_dim = lp.num_row_;
  }
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < ix_dim);
  assert(from_k <= to_k);
  HighsInt set_from_ix;
  HighsInt set_to_ix;
  HighsInt ignore_from_ix;
  HighsInt ignore_to_ix = -1;
  HighsInt current_set_entry = 0;
  // Given a basic-nonbasic partition, all status settings are defined
  // by the bounds unless boxed, in which case any definitive (ie not
  // just kNonbasic) existing status is retained. Otherwise, set to
  // bound nearer to zero
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, set_from_ix, set_to_ix, ignore_from_ix,
                     ignore_to_ix, current_set_entry);
    assert(set_to_ix < ix_dim);
    assert(ignore_to_ix < ix_dim);
    if (columns) {
      for (HighsInt iCol = set_from_ix; iCol <= set_to_ix; iCol++) {
        if (highs_basis.col_status[iCol] == HighsBasisStatus::kBasic) continue;
        // Nonbasic column
        double lower = lp.col_lower_[iCol];
        double upper = lp.col_upper_[iCol];
        HighsBasisStatus status = highs_basis.col_status[iCol];
        int8_t move = kIllegalMoveValue;
        if (lower == upper) {
          if (status == HighsBasisStatus::kNonbasic)
            status = HighsBasisStatus::kLower;
          move = kNonbasicMoveZe;
        } else if (!highs_isInfinity(-lower)) {
          // Finite lower bound so boxed or lower
          if (!highs_isInfinity(upper)) {
            // Finite upper bound so boxed
            if (status == HighsBasisStatus::kNonbasic) {
              // No definitive status, so set to bound nearer to zero
              if (fabs(lower) < fabs(upper)) {
                status = HighsBasisStatus::kLower;
                move = kNonbasicMoveUp;
              } else {
                status = HighsBasisStatus::kUpper;
                move = kNonbasicMoveDn;
              }
            } else if (status == HighsBasisStatus::kLower) {
              move = kNonbasicMoveUp;
            } else {
              move = kNonbasicMoveDn;
            }
          } else {
            // Lower (since upper bound is infinite)
            status = HighsBasisStatus::kLower;
            move = kNonbasicMoveUp;
          }
        } else if (!highs_isInfinity(upper)) {
          // Upper
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveDn;
        } else {
          // FREE
          status = HighsBasisStatus::kZero;
          move = kNonbasicMoveZe;
        }
        highs_basis.col_status[iCol] = status;
        if (has_simplex_basis) {
          assert(move != kIllegalMoveValue);
          simplex_basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
          simplex_basis.nonbasicMove_[iCol] = move;
        }
      }
    } else {
      for (HighsInt iRow = set_from_ix; iRow <= set_to_ix; iRow++) {
        if (highs_basis.row_status[iRow] == HighsBasisStatus::kBasic) continue;
        // Nonbasic column
        double lower = lp.row_lower_[iRow];
        double upper = lp.row_upper_[iRow];
        HighsBasisStatus status = highs_basis.row_status[iRow];
        int8_t move = kIllegalMoveValue;
        if (lower == upper) {
          if (status == HighsBasisStatus::kNonbasic)
            status = HighsBasisStatus::kLower;
          move = kNonbasicMoveZe;
        } else if (!highs_isInfinity(-lower)) {
          // Finite lower bound so boxed or lower
          if (!highs_isInfinity(upper)) {
            // Finite upper bound so boxed
            if (status == HighsBasisStatus::kNonbasic) {
              // No definitive status, so set to bound nearer to zero
              if (fabs(lower) < fabs(upper)) {
                status = HighsBasisStatus::kLower;
                move = kNonbasicMoveDn;
              } else {
                status = HighsBasisStatus::kUpper;
                move = kNonbasicMoveUp;
              }
            } else if (status == HighsBasisStatus::kLower) {
              move = kNonbasicMoveDn;
            } else {
              move = kNonbasicMoveUp;
            }
          } else {
            // Lower (since upper bound is infinite)
            status = HighsBasisStatus::kLower;
            move = kNonbasicMoveDn;
          }
        } else if (!highs_isInfinity(upper)) {
          // Upper
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveUp;
        } else {
          // FREE
          status = HighsBasisStatus::kZero;
          move = kNonbasicMoveZe;
        }
        highs_basis.row_status[iRow] = status;
        if (has_simplex_basis) {
          assert(move != kIllegalMoveValue);
          simplex_basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagTrue;
          simplex_basis.nonbasicMove_[lp.num_col_ + iRow] = move;
        }
      }
    }
    if (ignore_to_ix >= ix_dim - 1) break;
  }
}